

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testIO.cpp
# Opt level: O3

void testIO(string *tempDir)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  char cVar3;
  int iVar4;
  long *plVar5;
  long lVar6;
  char *pcVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  Header hdr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  FlatImage img1;
  long *local_138 [2];
  long local_128 [2];
  undefined2 *local_118;
  undefined8 uStack_110;
  undefined2 local_108;
  undefined6 uStack_106;
  long *local_d8;
  undefined8 uStack_d0;
  long local_c8;
  undefined4 local_c0;
  undefined1 local_bc;
  string local_a0 [3];
  undefined8 local_38;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Testing I/O based on image and file type",0x28);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
  std::ostream::put(-0x70);
  std::ostream::flush();
  pcVar2 = (tempDir->_M_dataplus)._M_p;
  local_d8 = &local_c8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_d8,pcVar2,pcVar2 + tempDir->_M_string_length);
  std::__cxx11::string::append((char *)&local_d8);
  local_118 = (undefined2 *)0x0;
  uStack_110._0_4_ = 5;
  uStack_110._4_4_ = 5;
  Imf_3_4::FlatImage::FlatImage((FlatImage *)local_a0,(Box *)&local_118,ONE_LEVEL,ROUND_DOWN);
  local_108 = 0x48;
  uStack_110._0_4_ = MIPMAP_LEVELS;
  uStack_110._4_4_ = ROUND_DOWN;
  local_118 = &local_108;
  Imf_3_4::Image::insertChannel((string *)local_a0,(PixelType)&local_118,1,1,true);
  if (local_118 != &local_108) {
    operator_delete(local_118,CONCAT62(uStack_106,local_108) + 1);
  }
  Imf_3_4::saveImage((string *)&local_d8,(Image *)local_a0);
  local_138[0] = (long *)0x0;
  Imf_3_4::Header::Header((Header *)0x3f800000,0x3f800000,&local_118,0x40,0x40,local_138,0,3);
  plVar5 = (long *)Imf_3_4::loadImage((string *)&local_d8,(Header *)&local_118);
  if (plVar5 != (long *)0x0) {
    lVar6 = __dynamic_cast(plVar5,&Imf_3_4::Image::typeinfo,&Imf_3_4::FlatImage::typeinfo);
    if (lVar6 != 0) {
      iVar4 = Imf_3_4::Image::levelMode();
      if (iVar4 != 0) {
        __assert_fail("img2->levelMode () == ONE_LEVEL",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRUtilTest/testIO.cpp"
                      ,0x27,"void (anonymous namespace)::testFlatScanLineImage1(const string &)");
      }
      iVar4 = Imf_3_4::Image::levelRoundingMode();
      if (iVar4 != 0) {
        __assert_fail("img2->levelRoundingMode () == ROUND_DOWN",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRUtilTest/testIO.cpp"
                      ,0x28,"void (anonymous namespace)::testFlatScanLineImage1(const string &)");
      }
      cVar3 = Imf_3_4::Header::hasTileDescription();
      if (cVar3 != '\0') {
        __assert_fail("!hdr.hasTileDescription ()",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRUtilTest/testIO.cpp"
                      ,0x29,"void (anonymous namespace)::testFlatScanLineImage1(const string &)");
      }
      (**(code **)(*plVar5 + 8))(plVar5);
      Imf_3_4::Header::~Header((Header *)&local_118);
      Imf_3_4::FlatImage::~FlatImage((FlatImage *)local_a0);
      if (local_d8 != &local_c8) {
        operator_delete(local_d8,local_c8 + 1);
      }
      local_138[0] = local_128;
      pcVar2 = (tempDir->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_138,pcVar2,pcVar2 + tempDir->_M_string_length);
      std::__cxx11::string::append((char *)local_138);
      local_118 = (undefined2 *)0x0;
      uStack_110._0_4_ = 5;
      uStack_110._4_4_ = 5;
      Imf_3_4::FlatImage::FlatImage((FlatImage *)local_a0,(Box *)&local_118,ONE_LEVEL,ROUND_DOWN);
      local_108 = 0x48;
      uStack_110._0_4_ = MIPMAP_LEVELS;
      uStack_110._4_4_ = ROUND_DOWN;
      local_118 = &local_108;
      Imf_3_4::Image::insertChannel((string *)local_a0,(PixelType)&local_118,1,1,true);
      if (local_118 != &local_108) {
        operator_delete(local_118,CONCAT62(uStack_106,local_108) + 1);
      }
      local_d8 = (long *)0x0;
      Imf_3_4::Header::Header((Header *)0x3f800000,0x3f800000,&local_118,0x40,0x40,&local_d8,0,3);
      local_c8 = 0x6961722073277469;
      local_c0 = 0x676e696e;
      uStack_d0 = 0xc;
      local_bc = 0;
      local_d8 = &local_c8;
      Imf_3_4::addComments((Header *)&local_118,(string *)&local_d8);
      if (local_d8 != &local_c8) {
        operator_delete(local_d8,local_c8 + 1);
      }
      Imf_3_4::saveImage((string *)local_138,(Header *)&local_118,(Image *)local_a0,
                         USE_IMAGE_DATA_WINDOW);
      local_38 = 0;
      Imf_3_4::Header::Header((Header *)0x3f800000,0x3f800000,&local_d8,0x40,0x40,&local_38,0,3);
      plVar5 = (long *)Imf_3_4::loadImage((string *)local_138,(Header *)&local_d8);
      if (plVar5 != (long *)0x0) {
        lVar6 = __dynamic_cast(plVar5,&Imf_3_4::Image::typeinfo,&Imf_3_4::FlatImage::typeinfo);
        if (lVar6 != 0) {
          iVar4 = Imf_3_4::Image::levelMode();
          if (iVar4 != 0) {
            __assert_fail("img2->levelMode () == ONE_LEVEL",
                          "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRUtilTest/testIO.cpp"
                          ,0x3d,"void (anonymous namespace)::testFlatScanLineImage2(const string &)"
                         );
          }
          iVar4 = Imf_3_4::Image::levelRoundingMode();
          if (iVar4 != 0) {
            __assert_fail("img2->levelRoundingMode () == ROUND_DOWN",
                          "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRUtilTest/testIO.cpp"
                          ,0x3e,"void (anonymous namespace)::testFlatScanLineImage2(const string &)"
                         );
          }
          cVar3 = Imf_3_4::Header::hasTileDescription();
          if (cVar3 != '\0') {
            __assert_fail("!hdr2.hasTileDescription ()",
                          "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRUtilTest/testIO.cpp"
                          ,0x3f,"void (anonymous namespace)::testFlatScanLineImage2(const string &)"
                         );
          }
          cVar3 = Imf_3_4::hasComments((Header *)&local_d8);
          if (cVar3 == '\0') {
            __assert_fail("hasComments (hdr2)",
                          "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRUtilTest/testIO.cpp"
                          ,0x40,"void (anonymous namespace)::testFlatScanLineImage2(const string &)"
                         );
          }
          pcVar7 = (char *)Imf_3_4::comments_abi_cxx11_((Header *)&local_d8);
          iVar4 = std::__cxx11::string::compare(pcVar7);
          if (iVar4 != 0) {
            __assert_fail("comments (hdr2) == \"it\'s raining\"",
                          "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRUtilTest/testIO.cpp"
                          ,0x41,"void (anonymous namespace)::testFlatScanLineImage2(const string &)"
                         );
          }
          (**(code **)(*plVar5 + 8))(plVar5);
          Imf_3_4::Header::~Header((Header *)&local_d8);
          Imf_3_4::Header::~Header((Header *)&local_118);
          Imf_3_4::FlatImage::~FlatImage((FlatImage *)local_a0);
          if (local_138[0] != local_128) {
            operator_delete(local_138[0],local_128[0] + 1);
          }
          paVar1 = &local_a0[0].field_2;
          pcVar2 = (tempDir->_M_dataplus)._M_p;
          local_a0[0]._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_a0,pcVar2,pcVar2 + tempDir->_M_string_length);
          std::__cxx11::string::append((char *)local_a0);
          anon_unknown.dwarf_37635::testFlatTiledImage1(local_a0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a0[0]._M_dataplus._M_p != paVar1) {
            operator_delete(local_a0[0]._M_dataplus._M_p,
                            local_a0[0].field_2._M_allocated_capacity + 1);
          }
          pcVar2 = (tempDir->_M_dataplus)._M_p;
          local_a0[0]._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_a0,pcVar2,pcVar2 + tempDir->_M_string_length);
          std::__cxx11::string::append((char *)local_a0);
          anon_unknown.dwarf_37635::testFlatTiledImage1(local_a0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a0[0]._M_dataplus._M_p != paVar1) {
            operator_delete(local_a0[0]._M_dataplus._M_p,
                            local_a0[0].field_2._M_allocated_capacity + 1);
          }
          pcVar2 = (tempDir->_M_dataplus)._M_p;
          local_d8 = &local_c8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_d8,pcVar2,pcVar2 + tempDir->_M_string_length);
          std::__cxx11::string::append((char *)&local_d8);
          local_118 = (undefined2 *)0x0;
          uStack_110._0_4_ = 5;
          uStack_110._4_4_ = 5;
          Imf_3_4::DeepImage::DeepImage
                    ((DeepImage *)local_a0,(Box *)&local_118,ONE_LEVEL,ROUND_DOWN);
          local_108 = 0x48;
          uStack_110._0_4_ = MIPMAP_LEVELS;
          uStack_110._4_4_ = ROUND_DOWN;
          local_118 = &local_108;
          Imf_3_4::Image::insertChannel((string *)local_a0,(PixelType)&local_118,1,1,true);
          if (local_118 != &local_108) {
            operator_delete(local_118,CONCAT62(uStack_106,local_108) + 1);
          }
          Imf_3_4::saveImage((string *)&local_d8,(Image *)local_a0);
          local_138[0] = (long *)0x0;
          Imf_3_4::Header::Header
                    ((Header *)0x3f800000,0x3f800000,&local_118,0x40,0x40,local_138,0,3);
          plVar5 = (long *)Imf_3_4::loadImage((string *)&local_d8,(Header *)&local_118);
          if (plVar5 != (long *)0x0) {
            lVar6 = __dynamic_cast(plVar5,&Imf_3_4::Image::typeinfo,&Imf_3_4::DeepImage::typeinfo);
            if (lVar6 != 0) {
              iVar4 = Imf_3_4::Image::levelMode();
              if (iVar4 != 0) {
                __assert_fail("img2->levelMode () == ONE_LEVEL",
                              "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRUtilTest/testIO.cpp"
                              ,0x7b,
                              "void (anonymous namespace)::testDeepScanLineImage1(const string &)");
              }
              iVar4 = Imf_3_4::Image::levelRoundingMode();
              if (iVar4 != 0) {
                __assert_fail("img2->levelRoundingMode () == ROUND_DOWN",
                              "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRUtilTest/testIO.cpp"
                              ,0x7c,
                              "void (anonymous namespace)::testDeepScanLineImage1(const string &)");
              }
              cVar3 = Imf_3_4::Header::hasTileDescription();
              if (cVar3 != '\0') {
                __assert_fail("!hdr.hasTileDescription ()",
                              "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRUtilTest/testIO.cpp"
                              ,0x7d,
                              "void (anonymous namespace)::testDeepScanLineImage1(const string &)");
              }
              (**(code **)(*plVar5 + 8))(plVar5);
              Imf_3_4::Header::~Header((Header *)&local_118);
              Imf_3_4::DeepImage::~DeepImage((DeepImage *)local_a0);
              if (local_d8 != &local_c8) {
                operator_delete(local_d8,local_c8 + 1);
              }
              local_138[0] = local_128;
              pcVar2 = (tempDir->_M_dataplus)._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)local_138,pcVar2,pcVar2 + tempDir->_M_string_length);
              std::__cxx11::string::append((char *)local_138);
              local_118 = (undefined2 *)0x0;
              uStack_110._0_4_ = 5;
              uStack_110._4_4_ = 5;
              Imf_3_4::DeepImage::DeepImage
                        ((DeepImage *)local_a0,(Box *)&local_118,ONE_LEVEL,ROUND_DOWN);
              local_108 = 0x48;
              uStack_110._0_4_ = MIPMAP_LEVELS;
              uStack_110._4_4_ = ROUND_DOWN;
              local_118 = &local_108;
              Imf_3_4::Image::insertChannel((string *)local_a0,(PixelType)&local_118,1,1,true);
              if (local_118 != &local_108) {
                operator_delete(local_118,CONCAT62(uStack_106,local_108) + 1);
              }
              local_d8 = (long *)0x0;
              Imf_3_4::Header::Header
                        ((Header *)0x3f800000,0x3f800000,&local_118,0x40,0x40,&local_d8,0,3);
              local_c8 = 0x6961722073277469;
              local_c0 = 0x676e696e;
              uStack_d0 = 0xc;
              local_bc = 0;
              local_d8 = &local_c8;
              Imf_3_4::addComments((Header *)&local_118,(string *)&local_d8);
              if (local_d8 != &local_c8) {
                operator_delete(local_d8,local_c8 + 1);
              }
              Imf_3_4::saveImage((string *)local_138,(Header *)&local_118,(Image *)local_a0,
                                 USE_IMAGE_DATA_WINDOW);
              local_38 = 0;
              Imf_3_4::Header::Header
                        ((Header *)0x3f800000,0x3f800000,&local_d8,0x40,0x40,&local_38,0,3);
              plVar5 = (long *)Imf_3_4::loadImage((string *)local_138,(Header *)&local_d8);
              if (plVar5 != (long *)0x0) {
                lVar6 = __dynamic_cast(plVar5,&Imf_3_4::Image::typeinfo,
                                       &Imf_3_4::DeepImage::typeinfo);
                if (lVar6 != 0) {
                  iVar4 = Imf_3_4::Image::levelMode();
                  if (iVar4 != 0) {
                    __assert_fail("img2->levelMode () == ONE_LEVEL",
                                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRUtilTest/testIO.cpp"
                                  ,0x91,
                                  "void (anonymous namespace)::testDeepScanLineImage2(const string &)"
                                 );
                  }
                  iVar4 = Imf_3_4::Image::levelRoundingMode();
                  if (iVar4 != 0) {
                    __assert_fail("img2->levelRoundingMode () == ROUND_DOWN",
                                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRUtilTest/testIO.cpp"
                                  ,0x92,
                                  "void (anonymous namespace)::testDeepScanLineImage2(const string &)"
                                 );
                  }
                  cVar3 = Imf_3_4::Header::hasTileDescription();
                  if (cVar3 != '\0') {
                    __assert_fail("!hdr2.hasTileDescription ()",
                                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRUtilTest/testIO.cpp"
                                  ,0x93,
                                  "void (anonymous namespace)::testDeepScanLineImage2(const string &)"
                                 );
                  }
                  cVar3 = Imf_3_4::hasComments((Header *)&local_d8);
                  if (cVar3 != '\0') {
                    pcVar7 = (char *)Imf_3_4::comments_abi_cxx11_((Header *)&local_d8);
                    iVar4 = std::__cxx11::string::compare(pcVar7);
                    if (iVar4 != 0) {
                      __assert_fail("comments (hdr2) == \"it\'s raining\"",
                                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRUtilTest/testIO.cpp"
                                    ,0x95,
                                    "void (anonymous namespace)::testDeepScanLineImage2(const string &)"
                                   );
                    }
                    (**(code **)(*plVar5 + 8))(plVar5);
                    Imf_3_4::Header::~Header((Header *)&local_d8);
                    Imf_3_4::Header::~Header((Header *)&local_118);
                    Imf_3_4::DeepImage::~DeepImage((DeepImage *)local_a0);
                    if (local_138[0] != local_128) {
                      operator_delete(local_138[0],local_128[0] + 1);
                    }
                    pcVar2 = (tempDir->_M_dataplus)._M_p;
                    local_d8 = &local_c8;
                    std::__cxx11::string::_M_construct<char*>
                              ((string *)&local_d8,pcVar2,pcVar2 + tempDir->_M_string_length);
                    std::__cxx11::string::append((char *)&local_d8);
                    local_118 = (undefined2 *)0x0;
                    uStack_110._0_4_ = 5;
                    uStack_110._4_4_ = 5;
                    Imf_3_4::DeepImage::DeepImage
                              ((DeepImage *)local_a0,(Box *)&local_118,MIPMAP_LEVELS,ROUND_DOWN);
                    local_108 = 0x48;
                    uStack_110._0_4_ = MIPMAP_LEVELS;
                    uStack_110._4_4_ = ROUND_DOWN;
                    local_118 = &local_108;
                    Imf_3_4::Image::insertChannel((string *)local_a0,(PixelType)&local_118,1,1,true)
                    ;
                    if (local_118 != &local_108) {
                      operator_delete(local_118,CONCAT62(uStack_106,local_108) + 1);
                    }
                    Imf_3_4::saveImage((string *)&local_d8,(Image *)local_a0);
                    local_138[0] = (long *)0x0;
                    Imf_3_4::Header::Header
                              ((Header *)0x3f800000,0x3f800000,&local_118,0x40,0x40,local_138,0,3);
                    plVar5 = (long *)Imf_3_4::loadImage((string *)&local_d8,(Header *)&local_118);
                    if (plVar5 != (long *)0x0) {
                      lVar6 = __dynamic_cast(plVar5,&Imf_3_4::Image::typeinfo,
                                             &Imf_3_4::DeepImage::typeinfo);
                      if (lVar6 != 0) {
                        iVar4 = Imf_3_4::Image::levelMode();
                        if (iVar4 != 1) {
                          __assert_fail("img2->levelMode () == MIPMAP_LEVELS",
                                        "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRUtilTest/testIO.cpp"
                                        ,0xa5,
                                        "void (anonymous namespace)::testDeepTiledImage1(const string &)"
                                       );
                        }
                        iVar4 = Imf_3_4::Image::levelRoundingMode();
                        if (iVar4 != 0) {
                          __assert_fail("img2->levelRoundingMode () == ROUND_DOWN",
                                        "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRUtilTest/testIO.cpp"
                                        ,0xa6,
                                        "void (anonymous namespace)::testDeepTiledImage1(const string &)"
                                       );
                        }
                        cVar3 = Imf_3_4::Header::hasTileDescription();
                        if (cVar3 == '\0') {
                          __assert_fail("hdr.hasTileDescription ()",
                                        "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRUtilTest/testIO.cpp"
                                        ,0xa7,
                                        "void (anonymous namespace)::testDeepTiledImage1(const string &)"
                                       );
                        }
                        (**(code **)(*plVar5 + 8))(plVar5);
                        Imf_3_4::Header::~Header((Header *)&local_118);
                        Imf_3_4::DeepImage::~DeepImage((DeepImage *)local_a0);
                        if (local_d8 != &local_c8) {
                          operator_delete(local_d8,local_c8 + 1);
                        }
                        local_138[0] = local_128;
                        pcVar2 = (tempDir->_M_dataplus)._M_p;
                        std::__cxx11::string::_M_construct<char*>
                                  ((string *)local_138,pcVar2,pcVar2 + tempDir->_M_string_length);
                        std::__cxx11::string::append((char *)local_138);
                        local_118 = (undefined2 *)0x0;
                        uStack_110._0_4_ = 5;
                        uStack_110._4_4_ = 5;
                        Imf_3_4::DeepImage::DeepImage
                                  ((DeepImage *)local_a0,(Box *)&local_118,ONE_LEVEL,ROUND_DOWN);
                        local_108 = 0x48;
                        uStack_110._0_4_ = MIPMAP_LEVELS;
                        uStack_110._4_4_ = ROUND_DOWN;
                        local_118 = &local_108;
                        Imf_3_4::Image::insertChannel
                                  ((string *)local_a0,(PixelType)&local_118,1,1,true);
                        if (local_118 != &local_108) {
                          operator_delete(local_118,CONCAT62(uStack_106,local_108) + 1);
                        }
                        local_d8 = (long *)0x0;
                        Imf_3_4::Header::Header
                                  ((Header *)0x3f800000,0x3f800000,&local_118,0x40,0x40,&local_d8,0,
                                   3);
                        local_d8 = (long *)0x2000000020;
                        uStack_d0 = 0;
                        Imf_3_4::Header::setTileDescription((TileDescription *)&local_118);
                        Imf_3_4::saveImage((string *)local_138,(Header *)&local_118,
                                           (Image *)local_a0,USE_IMAGE_DATA_WINDOW);
                        local_38 = 0;
                        Imf_3_4::Header::Header
                                  ((Header *)0x3f800000,0x3f800000,&local_d8,0x40,0x40,&local_38,0,3
                                  );
                        plVar5 = (long *)Imf_3_4::loadImage((string *)local_138,(Header *)&local_d8)
                        ;
                        if (plVar5 != (long *)0x0) {
                          lVar6 = __dynamic_cast(plVar5,&Imf_3_4::Image::typeinfo,
                                                 &Imf_3_4::DeepImage::typeinfo,0);
                          if (lVar6 != 0) {
                            iVar4 = Imf_3_4::Image::levelMode();
                            if (iVar4 != 0) {
                              __assert_fail("img2->levelMode () == ONE_LEVEL",
                                            "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRUtilTest/testIO.cpp"
                                            ,0xbb,
                                            "void (anonymous namespace)::testDeepTiledImage2(const string &)"
                                           );
                            }
                            iVar4 = Imf_3_4::Image::levelRoundingMode();
                            if (iVar4 == 0) {
                              cVar3 = Imf_3_4::Header::hasTileDescription();
                              if (cVar3 != '\0') {
                                (**(code **)(*plVar5 + 8))(plVar5);
                                Imf_3_4::Header::~Header((Header *)&local_d8);
                                Imf_3_4::Header::~Header((Header *)&local_118);
                                Imf_3_4::DeepImage::~DeepImage((DeepImage *)local_a0);
                                if (local_138[0] != local_128) {
                                  operator_delete(local_138[0],local_128[0] + 1);
                                }
                                std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)&std::cout,"ok\n",3);
                                std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
                                std::ostream::put(-0x70);
                                std::ostream::flush();
                                pcVar2 = (tempDir->_M_dataplus)._M_p;
                                local_a0[0]._M_dataplus._M_p = (pointer)paVar1;
                                std::__cxx11::string::_M_construct<char*>
                                          ((string *)local_a0,pcVar2,
                                           pcVar2 + tempDir->_M_string_length);
                                std::__cxx11::string::append((char *)local_a0);
                                remove(local_a0[0]._M_dataplus._M_p);
                                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                     *)local_a0[0]._M_dataplus._M_p != paVar1) {
                                  operator_delete(local_a0[0]._M_dataplus._M_p,
                                                  local_a0[0].field_2._M_allocated_capacity + 1);
                                }
                                return;
                              }
                              __assert_fail("hdr2.hasTileDescription ()",
                                            "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRUtilTest/testIO.cpp"
                                            ,0xbd,
                                            "void (anonymous namespace)::testDeepTiledImage2(const string &)"
                                           );
                            }
                            __assert_fail("img2->levelRoundingMode () == ROUND_DOWN",
                                          "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRUtilTest/testIO.cpp"
                                          ,0xbc,
                                          "void (anonymous namespace)::testDeepTiledImage2(const string &)"
                                         );
                          }
                        }
                        __assert_fail("dynamic_cast<DeepImage*> (img2)",
                                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRUtilTest/testIO.cpp"
                                      ,0xba,
                                      "void (anonymous namespace)::testDeepTiledImage2(const string &)"
                                     );
                      }
                    }
                    __assert_fail("dynamic_cast<DeepImage*> (img2)",
                                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRUtilTest/testIO.cpp"
                                  ,0xa4,
                                  "void (anonymous namespace)::testDeepTiledImage1(const string &)")
                    ;
                  }
                  __assert_fail("hasComments (hdr2)",
                                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRUtilTest/testIO.cpp"
                                ,0x94,
                                "void (anonymous namespace)::testDeepScanLineImage2(const string &)"
                               );
                }
              }
              __assert_fail("dynamic_cast<DeepImage*> (img2)",
                            "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRUtilTest/testIO.cpp"
                            ,0x90,
                            "void (anonymous namespace)::testDeepScanLineImage2(const string &)");
            }
          }
          __assert_fail("dynamic_cast<DeepImage*> (img2)",
                        "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRUtilTest/testIO.cpp"
                        ,0x7a,"void (anonymous namespace)::testDeepScanLineImage1(const string &)");
        }
      }
      __assert_fail("dynamic_cast<FlatImage*> (img2)",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRUtilTest/testIO.cpp"
                    ,0x3c,"void (anonymous namespace)::testFlatScanLineImage2(const string &)");
    }
  }
  __assert_fail("dynamic_cast<FlatImage*> (img2)",
                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRUtilTest/testIO.cpp"
                ,0x26,"void (anonymous namespace)::testFlatScanLineImage1(const string &)");
}

Assistant:

void
testIO (const string& tempDir)
{
    try
    {
        cout << "Testing I/O based on image and file type" << endl;

        testFlatScanLineImage1 (tempDir + "io.exr");
        testFlatScanLineImage2 (tempDir + "io.exr");
        testFlatTiledImage1 (tempDir + "io.exr");
        testFlatTiledImage1 (tempDir + "io.exr");
        testDeepScanLineImage1 (tempDir + "io.exr");
        testDeepScanLineImage2 (tempDir + "io.exr");
        testDeepTiledImage1 (tempDir + "io.exr");
        testDeepTiledImage2 (tempDir + "io.exr");

        cout << "ok\n" << endl;
    }
    catch (const std::exception& e)
    {
        cerr << "ERROR -- caught exception: " << e.what () << endl;
        assert (false);
    }
    remove ((tempDir + "io.exr").c_str ());
}